

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O3

void __thiscall leveldb::Benchmark::ReadRandom(Benchmark *this,ThreadState *thread)

{
  DB *pDVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  Slice msg_00;
  string value;
  ReadOptions options;
  char msg [100];
  void *local_e0;
  string *local_d8;
  size_t local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  undefined2 local_a8 [4];
  undefined8 local_a0;
  string local_98 [3];
  
  local_a8[0] = 0x100;
  uVar7 = 0;
  local_a0 = 0;
  local_c8 = local_b8;
  local_c0 = 0;
  local_b8[0] = 0;
  if (0 < this->reads_) {
    uVar7 = 0;
    iVar9 = 0;
    do {
      uVar6 = (ulong)(thread->rand).seed_ * 0x41a7;
      uVar5 = (uint)uVar6 & 0x7fffffff;
      iVar2 = (int)(uVar6 >> 0x1f);
      uVar8 = iVar2 + uVar5;
      uVar5 = iVar2 + uVar5 + 0x80000001;
      if (-1 < (int)uVar8) {
        uVar5 = uVar8;
      }
      (thread->rand).seed_ = uVar5;
      snprintf((char *)local_98,100,"%016d",(ulong)uVar5 % (ulong)(uint)FLAGS_num);
      pDVar1 = this->db_;
      local_d8 = local_98;
      local_d0 = strlen((char *)local_98);
      (*pDVar1->_vptr_DB[5])(&local_e0,pDVar1,local_a8,&local_d8,&local_c8);
      pvVar3 = local_e0;
      if (local_e0 != (void *)0x0) {
        operator_delete__(local_e0);
      }
      anon_unknown_0::Stats::FinishedSingleOp(&thread->stats);
      uVar7 = (ulong)((int)uVar7 + (uint)(pvVar3 == (void *)0x0));
      iVar9 = iVar9 + 1;
    } while (iVar9 < this->reads_);
  }
  snprintf((char *)local_98,100,"(%d of %d found)",uVar7,(ulong)(uint)this->num_);
  pcVar4 = (char *)strlen((char *)local_98);
  msg_00.size_ = uVar7;
  msg_00.data_ = pcVar4;
  anon_unknown_0::AppendWithSpace((anon_unknown_0 *)&(thread->stats).message_,local_98,msg_00);
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  return;
}

Assistant:

void ReadRandom(ThreadState* thread) {
    ReadOptions options;
    std::string value;
    int found = 0;
    for (int i = 0; i < reads_; i++) {
      char key[100];
      const int k = thread->rand.Next() % FLAGS_num;
      snprintf(key, sizeof(key), "%016d", k);
      if (db_->Get(options, key, &value).ok()) {
        found++;
      }
      thread->stats.FinishedSingleOp();
    }
    char msg[100];
    snprintf(msg, sizeof(msg), "(%d of %d found)", found, num_);
    thread->stats.AddMessage(msg);
  }